

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall
checkqueue_tests::test_CheckQueue_Correct_Random::test_method(test_CheckQueue_Correct_Random *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> range;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff58;
  unsigned_long *in_stack_ffffffffffffff60;
  pointer *in_stack_ffffffffffffff68;
  RandomMixin<FastRandomContext> *this_00;
  size_type in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  ulong local_28;
  RandomMixin<FastRandomContext> local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffff0;
  CheckQueueTest *this_02;
  
  this_02 = *(CheckQueueTest **)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  this_01 = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_stack_ffffffffffffff58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (this_01,in_stack_ffffffffffffff90);
  for (local_28 = 2; local_28 < 100000; local_28 = *in_stack_ffffffffffffff60 + local_28) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff68 =
         &in_RDI[0xb].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish;
    std::min<unsigned_long>(in_stack_ffffffffffffff60,(unsigned_long *)in_stack_ffffffffffffff58);
    RandomMixin<FastRandomContext>::randrange<unsigned_long>(this_00,(unsigned_long)in_RDI);
    in_stack_ffffffffffffff60 =
         std::max<unsigned_long>
                   (in_stack_ffffffffffffff60,(unsigned_long *)in_stack_ffffffffffffff58);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  CheckQueueTest::Correct_Queue_range(this_02,in_stack_fffffffffffffff0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff68);
  if (*(CheckQueueTest **)(in_FS_OFFSET + 0x28) == this_02) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Correct_Random)
{
    std::vector<size_t> range;
    range.reserve(100000/1000);
    for (size_t i = 2; i < 100000; i += std::max((size_t)1, (size_t)m_rng.randrange(std::min((size_t)1000, ((size_t)100000) - i))))
        range.push_back(i);
    Correct_Queue_range(range);
}